

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

int hts_idx_load_core(hts_idx_t *idx,void *fp,int fmt)

{
  int32_t *data;
  int iVar1;
  uint uVar2;
  bins_t *pbVar3;
  lidx_t *plVar4;
  khint_t kVar5;
  kh_bin_t *h;
  size_t sVar6;
  ssize_t sVar7;
  hts_pair64_t *data_00;
  uint64_t *puVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  FILE *__stream;
  bool bVar12;
  uint32_t key;
  int32_t n;
  int absent;
  int local_64;
  khint32_t local_60;
  int local_5c;
  FILE *local_58;
  lidx_t *local_50;
  int local_44;
  hts_idx_t *local_40;
  long local_38;
  
  if (idx == (hts_idx_t *)0x0) {
    iVar11 = -4;
  }
  else {
    local_58 = (FILE *)fp;
    if (0 < idx->n) {
      lVar10 = 0;
      local_40 = idx;
      do {
        local_50 = idx->lidx + lVar10;
        h = (kh_bin_t *)calloc(1,0x28);
        idx->bidx[lVar10] = h;
        if (fmt == 1) {
          sVar6 = fread(&local_5c,1,4,local_58);
        }
        else {
          sVar6 = bgzf_read((BGZF *)local_58,&local_5c,4);
        }
        if (sVar6 == 4) {
          local_38 = lVar10;
          if (0 < local_5c) {
            iVar11 = 0;
            __stream = local_58;
            do {
              if (fmt == 1) {
                sVar6 = fread(&local_60,1,4,__stream);
              }
              else {
                sVar6 = bgzf_read((BGZF *)__stream,&local_60,4);
              }
              if (sVar6 == 4) {
                kVar5 = kh_put_bin(h,local_60,&local_44);
                if (local_44 < 1) {
                  local_64 = -3;
                  bVar12 = false;
                }
                else {
                  pbVar3 = h->vals;
                  puVar8 = &pbVar3[kVar5].loff;
                  if (fmt == 0) {
                    sVar7 = bgzf_read((BGZF *)__stream,puVar8,8);
                    if (sVar7 == 8) goto LAB_001105c4;
LAB_0011063d:
                    local_64 = -1;
                  }
                  else {
                    *puVar8 = 0;
LAB_001105c4:
                    pbVar3 = pbVar3 + kVar5;
                    data = &pbVar3->n;
                    if (fmt == 1) {
                      sVar6 = fread(data,1,4,__stream);
                    }
                    else {
                      sVar6 = bgzf_read((BGZF *)__stream,data,4);
                    }
                    if (sVar6 != 4) goto LAB_0011063d;
                    iVar1 = pbVar3->n;
                    pbVar3->m = iVar1;
                    data_00 = (hts_pair64_t *)malloc((long)iVar1 << 4);
                    __stream = local_58;
                    pbVar3->list = data_00;
                    if (data_00 != (hts_pair64_t *)0x0) {
                      if (fmt == 1) {
                        sVar6 = fread(data_00,1,(long)(iVar1 << 4),local_58);
                      }
                      else {
                        sVar6 = bgzf_read((BGZF *)local_58,data_00,(long)(iVar1 << 4));
                      }
                      bVar12 = sVar6 == (long)(*data << 4);
                      if (!bVar12) {
                        local_64 = -1;
                      }
                      goto LAB_0011068e;
                    }
                    local_64 = -2;
                  }
                  bVar12 = false;
                }
              }
              else {
                bVar12 = false;
                local_64 = -1;
              }
LAB_0011068e:
              if (!bVar12) {
                bVar12 = false;
                lVar10 = local_38;
                idx = local_40;
                goto LAB_001107e6;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_5c);
          }
          lVar10 = local_38;
          idx = local_40;
          bVar12 = true;
          if (fmt != 0) {
            if (fmt == 1) {
              sVar6 = fread(local_50,1,4,local_58);
            }
            else {
              sVar6 = bgzf_read((BGZF *)local_58,local_50,4);
            }
            plVar4 = local_50;
            if (sVar6 != 4) goto LAB_001107dc;
            iVar11 = local_50->n;
            local_50->m = iVar11;
            puVar8 = (uint64_t *)malloc((long)iVar11 << 3);
            plVar4->offset = puVar8;
            if (puVar8 == (uint64_t *)0x0) {
              local_64 = -2;
              bVar12 = false;
            }
            else {
              if (fmt == 1) {
                sVar6 = fread(puVar8,1,(long)(iVar11 * 8),local_58);
              }
              else {
                sVar6 = bgzf_read((BGZF *)local_58,puVar8,(long)(iVar11 * 8));
              }
              uVar2 = local_50->n;
              if (sVar6 != (long)(int)(uVar2 * 8)) goto LAB_001107dc;
              if (1 < (int)uVar2) {
                puVar8 = local_50->offset;
                uVar9 = 1;
                do {
                  if (puVar8[uVar9] == 0) {
                    puVar8[uVar9] = puVar8[uVar9 - 1];
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar2 != uVar9);
              }
              update_loff(idx,(int)lVar10,1);
              bVar12 = true;
            }
          }
        }
        else {
LAB_001107dc:
          bVar12 = false;
          local_64 = -1;
        }
LAB_001107e6:
        if (!bVar12) {
          return local_64;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < idx->n);
    }
    puVar8 = &idx->n_no_coor;
    if (fmt == 1) {
      sVar6 = fread(puVar8,1,8,local_58);
    }
    else {
      sVar6 = bgzf_read((BGZF *)local_58,puVar8,8);
    }
    iVar11 = 0;
    if (sVar6 != 8) {
      *puVar8 = 0;
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

static int hts_idx_load_core(hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, n, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (idx == NULL) return -4;
    for (i = 0; i < idx->n; ++i) {
        bidx_t *h;
        lidx_t *l = &idx->lidx[i];
        uint32_t key;
        int j, absent;
        bins_t *p;
        h = idx->bidx[i] = kh_init(bin);
        if (idx_read(is_bgzf, fp, &n, 4) != 4) return -1;
        if (is_be) ed_swap_4p(&n);
        for (j = 0; j < n; ++j) {
            khint_t k;
            if (idx_read(is_bgzf, fp, &key, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&key);
            k = kh_put(bin, h, key, &absent);
            if (absent <= 0) return -3; // Duplicate bin number
            p = &kh_val(h, k);
            if (fmt == HTS_FMT_CSI) {
                if (idx_read(is_bgzf, fp, &p->loff, 8) != 8) return -1;
                if (is_be) ed_swap_8p(&p->loff);
            } else p->loff = 0;
            if (idx_read(is_bgzf, fp, &p->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&p->n);
            p->m = p->n;
            p->list = (hts_pair64_t*)malloc(p->m * sizeof(hts_pair64_t));
            if (p->list == NULL) return -2;
            if (idx_read(is_bgzf, fp, p->list, p->n<<4) != p->n<<4) return -1;
            if (is_be) swap_bins(p);
        }
        if (fmt != HTS_FMT_CSI) { // load linear index
            int j;
            if (idx_read(is_bgzf, fp, &l->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&l->n);
            l->m = l->n;
            l->offset = (uint64_t*)malloc(l->n * sizeof(uint64_t));
            if (l->offset == NULL) return -2;
            if (idx_read(is_bgzf, fp, l->offset, l->n << 3) != l->n << 3) return -1;
            if (is_be) for (j = 0; j < l->n; ++j) ed_swap_8p(&l->offset[j]);
            for (j = 1; j < l->n; ++j) // fill missing values; may happen given older samtools and tabix
                if (l->offset[j] == 0) l->offset[j] = l->offset[j-1];
            update_loff(idx, i, 1);
        }
    }
    if (idx_read(is_bgzf, fp, &idx->n_no_coor, 8) != 8) idx->n_no_coor = 0;
    if (is_be) ed_swap_8p(&idx->n_no_coor);
    return 0;
}